

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest9::initTest(FunctionalTest9 *this)

{
  uint uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  pointer __dest;
  TestError *this_00;
  uint n_xfb_varyings;
  size_type __dnew;
  char *xfb_varyings [1];
  uint local_dc;
  string local_d8;
  string local_b8;
  char *local_98;
  string local_90;
  string local_70;
  string local_50;
  Functions *gl;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  local_98 = "result";
  local_dc = 1;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_d8._M_dataplus._M_p = (pointer)0x2e3;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_d8);
  _Var2._M_p = local_d8._M_dataplus._M_p;
  local_b8.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType1(inout float);\nsubroutine void subroutineType2(inout float);\nsubroutine void subroutineType3(inout float);\n\nsubroutine(subroutineType1, subroutineType2, subroutineType3) void function(inout float result)\n{\n    result += float(0.123) + float(gl_VertexID);\n}\n\nsubroutine uniform subroutineType1 subroutine_uniform1;\nsubroutine uniform subroutineType2 subroutine_uniform2;\nsubroutine uniform subroutineType3 subroutine_uniform3;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(0, 1, 2, 3);\n\n    subroutine_uniform1(result.x);\n    subroutine_uniform2(result.y);\n    subroutine_uniform3(result.z);\n\n    result.w += result.x + result.y + result.z;\n}\n"
         ,0x2e3);
  local_b8._M_string_length = (size_type)_Var2._M_p;
  __dest[_Var2._M_p] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,0x1af8059);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1af8059);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,0x1af8059);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,0x1af8059);
  bVar3 = Utils::buildProgram(gl,&local_b8,&local_d8,&local_50,&local_70,&local_90,&local_98,
                              &local_dc,&this->m_vs_id,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,
                              (GLuint *)0x0,&this->m_po_id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  if (bVar3) {
    uVar1 = this->m_n_points_to_draw;
    (*gl->genBuffers)(1,&this->m_xfb_bo_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13ae);
    (*gl->bindBuffer)(0x8c8e,this->m_xfb_bo_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b1);
    (*gl->bindBufferBase)(0x8c8e,0,this->m_xfb_bo_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glBindBufferBase() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b4);
    (*gl->bufferData)(0x8c8e,(ulong)(uVar1 << 4),(void *)0x0,0x88e6);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13b8);
    (*gl->genVertexArrays)(1,&this->m_vao_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bc);
    (*gl->bindVertexArray)(this->m_vao_id);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x13bf);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program failed to link successfully",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x13a7);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest9::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up program object */
	const char* xfb_varyings[] = { "result" };

	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);
	if (!Utils::buildProgram(gl, getVertexShaderBody(), "",					  /* tc_body */
							 "",											  /* te_body */
							 "",											  /* gs_body */
							 "",											  /* fs_body */
							 xfb_varyings, n_xfb_varyings, &m_vs_id, DE_NULL, /* out_tc_id */
							 DE_NULL,										  /* out_te_id */
							 DE_NULL,										  /* out_gs_id */
							 DE_NULL,										  /* out_fs_id */
							 &m_po_id))
	{
		TCU_FAIL("Program failed to link successfully");
	}

	/* Set up a buffer object we will use to hold XFB data */
	const unsigned int xfb_bo_size = static_cast<unsigned int>(sizeof(float) * 4 /* components */ * m_n_points_to_draw);

	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_bo_size, DE_NULL, /* data */
				  GL_STATIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");
}